

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O1

btScalar __thiscall
btJacobianEntry::getRelativeVelocity
          (btJacobianEntry *this,btVector3 *linvelA,btVector3 *angvelA,btVector3 *linvelB,
          btVector3 *angvelB)

{
  return (this->m_linearJointAxis).m_floats[2] * (linvelA->m_floats[2] - linvelB->m_floats[2]) +
         (this->m_bJ).m_floats[2] * angvelB->m_floats[2] +
         (this->m_aJ).m_floats[2] * angvelA->m_floats[2] +
         (linvelA->m_floats[1] - linvelB->m_floats[1]) * (this->m_linearJointAxis).m_floats[1] +
         angvelB->m_floats[1] * (this->m_bJ).m_floats[1] +
         angvelA->m_floats[1] * (this->m_aJ).m_floats[1] +
         (this->m_linearJointAxis).m_floats[0] * (linvelA->m_floats[0] - linvelB->m_floats[0]) +
         (this->m_bJ).m_floats[0] * angvelB->m_floats[0] +
         (this->m_aJ).m_floats[0] * angvelA->m_floats[0] + 1.1920929e-07;
}

Assistant:

SIMD_FORCE_INLINE btVector3
operator-(const btVector3& v1, const btVector3& v2)
{
#if defined BT_USE_SIMD_VECTOR3 && (defined(BT_USE_SSE_IN_API)  && defined(BT_USE_SSE))

	//	without _mm_and_ps this code causes slowdown in Concave moving
	__m128 r = _mm_sub_ps(v1.mVec128, v2.mVec128);
	return btVector3(_mm_and_ps(r, btvFFF0fMask));
#elif defined(BT_USE_NEON)
	float32x4_t r = vsubq_f32(v1.mVec128, v2.mVec128);
	return btVector3((float32x4_t)vandq_s32((int32x4_t)r, btvFFF0Mask));
#else
	return btVector3(
			v1.m_floats[0] - v2.m_floats[0],
			v1.m_floats[1] - v2.m_floats[1],
			v1.m_floats[2] - v2.m_floats[2]);
#endif
}